

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs_wrapper.hpp
# Opt level: O2

AVSValue __thiscall
AVSInterface::Create<TMedian>
          (AVSInterface *this,AVSValue *args,void *user_data,IScriptEnvironment *env)

{
  AVSWrapper<TMedian> *this_00;
  anon_union_8_9_d3d94a0b_for_AVSValue_2 extraout_RDX;
  AVSValue AVar1;
  AVSValue local_30;
  
  this_00 = (AVSWrapper<TMedian> *)operator_new(0x100);
  AVSValue::AVSValue(&local_30,args);
  AVSWrapper<TMedian>::AVSWrapper(this_00,&local_30,env);
  AVSValue::~AVSValue(&local_30);
  AVSWrapper<TMedian>::Initialize(this_00);
  AVSValue::AVSValue((AVSValue *)this,(IClip *)this_00);
  AVar1.field_2.clip = extraout_RDX.clip;
  AVar1._0_8_ = this;
  return AVar1;
}

Assistant:

AVSValue __cdecl Create(AVSValue args, void* user_data, IScriptEnvironment* env)
  {
    auto filter = new AVSWrapper<FilterType>(args, env);
    try {
      filter->Initialize();
    }
    catch (const char *err) {
      env->ThrowError("%s: %s", filter->data.AVSName(), err);
    }
    return filter;
  }